

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

void set_scheme_id_uri(vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in,string *urn)

{
  pointer puVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  bool bVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  size_t l;
  ulong uVar6;
  size_t i;
  pointer puVar7;
  ulong uVar8;
  size_t i_2;
  size_t i_1;
  allocator_type local_1a9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> l_last;
  string or_urn;
  vector<unsigned_char,_std::allocator<unsigned_char>_> l_first;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar7 = (pointer)0x0;
  while( true ) {
    puVar1 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish + (-0x10 - (long)puVar1) <= puVar7) goto LAB_00150dc9;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&or_urn,(char *)(puVar7 + (long)puVar1),(allocator<char> *)&local_148);
    iVar3 = std::__cxx11::string::compare((char *)&or_urn);
    std::__cxx11::string::~string((string *)&or_urn);
    if (iVar3 == 0) break;
    puVar7 = puVar7 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&or_urn,
             (char *)(puVar7 + (long)((moov_in->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 0x18)),
             (allocator<char> *)&local_148);
  uVar8 = urn->_M_string_length;
  iVar3 = (int)or_urn._M_string_length - (int)uVar8;
  if (iVar3 == 0) {
    lVar4 = 0x18;
    for (uVar6 = 0; uVar6 < uVar8; uVar6 = uVar6 + 1) {
      puVar7[(long)((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start + lVar4)] =
           (urn->_M_dataplus)._M_p[uVar6];
      uVar8 = urn->_M_string_length;
      lVar4 = lVar4 + 1;
    }
  }
  else {
    __first._M_current =
         (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,__first,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(__first._M_current + (long)(puVar7 + 0x18)),&local_1a9);
    Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&l_first,&local_148);
    Catch::clara::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_148);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar7 + (long)((moov_in->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start +
                                 CONCAT44(or_urn._M_string_length._4_4_,(int)or_urn._M_string_length
                                         ) + 0x19)),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish,&local_1a9);
    Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&l_last,&local_148);
    Catch::clara::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_148);
  }
  std::__cxx11::string::~string((string *)&or_urn);
  if (iVar3 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (moov_in,(long)l_first.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)l_first.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (moov_in,(size_type)
                       (l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (long)((moov_in->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish +
                             ((urn->_M_string_length -
                              (long)(moov_in->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start) -
                             (long)l_last.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + 1)));
    for (uVar8 = 0; uVar8 < urn->_M_string_length; uVar8 = uVar8 + 1) {
      or_urn._M_dataplus._M_p._0_1_ = (urn->_M_dataplus)._M_p[uVar8];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (moov_in,(uchar *)&or_urn);
    }
    or_urn._M_dataplus._M_p._0_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (moov_in,(uchar *)&or_urn);
    for (uVar8 = 0;
        uVar8 < (ulong)((long)l_last.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)l_last.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start); uVar8 = uVar8 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (moov_in,l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar8);
    }
    uVar8 = 0;
    while( true ) {
      puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) <= uVar8) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"stsd",(allocator<char> *)&or_urn);
      bVar2 = compare_4cc((char *)(puVar7 + uVar8),&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      if (bVar2) {
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(uint *)(puVar7 + (uVar8 - 4));
        uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) -
                iVar3;
        *(uint *)(puVar7 + (uVar8 - 4)) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
      }
      puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"stbl",(allocator<char> *)&or_urn);
      bVar2 = compare_4cc((char *)(puVar7 + uVar8),&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) {
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(uint *)(puVar7 + (uVar8 - 4));
        uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) -
                iVar3;
        *(uint *)(puVar7 + (uVar8 - 4)) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
      }
      puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"uri ",(allocator<char> *)&or_urn);
      bVar2 = compare_4cc((char *)(puVar7 + uVar8),&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar2) {
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(uint *)(puVar7 + (uVar8 - 4));
        uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) -
                iVar3;
        *(uint *)(puVar7 + (uVar8 - 4)) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
      }
      puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"urim",(allocator<char> *)&or_urn);
      bVar2 = compare_4cc((char *)(puVar7 + uVar8),&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar2) {
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(uint *)(puVar7 + (uVar8 - 4));
        uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) -
                iVar3;
        *(uint *)(puVar7 + (uVar8 - 4)) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
      }
      puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"minf",(allocator<char> *)&or_urn);
      bVar2 = compare_4cc((char *)(puVar7 + uVar8),&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (bVar2) {
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(uint *)(puVar7 + (uVar8 - 4));
        uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) -
                iVar3;
        *(uint *)(puVar7 + (uVar8 - 4)) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
      }
      puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"mdia",(allocator<char> *)&or_urn);
      bVar2 = compare_4cc((char *)(puVar7 + uVar8),&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      if (bVar2) {
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(uint *)(puVar7 + (uVar8 - 4));
        uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) -
                iVar3;
        *(uint *)(puVar7 + (uVar8 - 4)) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
      }
      puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"trak",(allocator<char> *)&or_urn);
      bVar2 = compare_4cc((char *)(puVar7 + uVar8),&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      if (bVar2) {
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(uint *)(puVar7 + (uVar8 - 4));
        uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) -
                iVar3;
        *(uint *)(puVar7 + (uVar8 - 4)) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
      }
      puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"moov",(allocator<char> *)&or_urn);
      bVar2 = compare_4cc((char *)(puVar7 + uVar8),&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      if (bVar2) {
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(uint *)(puVar7 + (uVar8 - 4));
        uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) -
                iVar3;
        *(uint *)(puVar7 + (uVar8 - 4)) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
      }
      uVar8 = uVar8 + 1;
    }
  }
LAB_00150dc9:
  Catch::clara::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&l_last);
  Catch::clara::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&l_first);
  return;
}

Assistant:

void set_scheme_id_uri(std::vector<uint8_t> &moov_in, 
	const std::string& urn)
{
	int32_t size_diff = 0;

	std::vector<uint8_t> l_first;
	std::vector<uint8_t> l_last;

	// find the uri box containing the description of the urn, caerfull only use for the enclosed mdat box in the source code
	for (std::size_t k = 0; k < moov_in.size() - 16; k++)
	{
		if (std::string((char *)&moov_in[k]).compare("urim") == 0)
		{
			//cout << "urim box found" << endl;
			std::string or_urn = std::string((char *)&moov_in[k + 24]);
			size_diff = (int32_t)(or_urn.size() - urn.size());

			if (size_diff == 0)
			{
				for (std::size_t l = 0; l < urn.size(); l++)
					moov_in[k + 24 + l] = urn[l];
			}
			else
			{
				// first part of the string
				l_first = std::vector<uint8_t>(moov_in.begin(), moov_in.begin() + k + 24);
				// last part of the string
				l_last = std::vector<uint8_t>(moov_in.begin() + k + 24 + or_urn.size() + 1, moov_in.end());
			}
			break;
		}
	}

	// new string representing the moov_box 
	if (size_diff != 0)
	{
		// cout << "scheme size difference is: " << size_diff << endl;

		moov_in.resize(l_first.size());
		moov_in.reserve(moov_in.size() + urn.size() + l_last.size() + 1);

		for (std::size_t i = 0; i < urn.size(); i++)
			moov_in.push_back(urn[i]);
		moov_in.push_back('\0');
		for (std::size_t i = 0; i < l_last.size(); i++)
			moov_in.push_back(l_last[i]);

		for (std::size_t i = 0; i < moov_in.size(); i++)
		{
			if (compare_4cc((char *)&moov_in[i], std::string("stsd")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("stbl")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("uri ")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("urim")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("minf")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("mdia")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("trak")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("moov")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
		}
	}
}